

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tasks.h
# Opt level: O0

void __thiscall AI::Task::Task(Task *this,Task *param_1)

{
  int iVar1;
  TaskIdentifier TVar2;
  bool bVar3;
  Task *param_1_local;
  Task *this_local;
  
  Condition::Condition(&this->preconditions,&param_1->preconditions);
  Condition::Condition(&this->postconditions,&param_1->postconditions);
  Condition::Condition(&this->breakConditions,&param_1->breakConditions);
  this->type = param_1->type;
  std::vector<AI::Task,_std::allocator<AI::Task>_>::vector(&this->subtasks,&param_1->subtasks);
  iVar1 = param_1->maxRepeats;
  this->parentTaskIndex = param_1->parentTaskIndex;
  this->maxRepeats = iVar1;
  this->remainingRepeats = param_1->remainingRepeats;
  std::
  map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
  ::map(&this->modifiedFlags,&param_1->modifiedFlags);
  std::
  map<WorldStateIdentifier,_float,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_float>_>_>
  ::map(&this->modifiedValues,&param_1->modifiedValues);
  std::
  map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
  ::map(&this->modifiedVectors,&param_1->modifiedVectors);
  TVar2 = param_1->identifier;
  this->action = param_1->action;
  this->identifier = TVar2;
  std::function<void_(AI::Task_&,_AI::WorldState_&,_const_AI::WorldQuerier_&)>::function
            (&this->setup,&param_1->setup);
  std::function<void_(AI::WorldState_&,_AI::Task_&)>::function(&this->finish,&param_1->finish);
  std::function<void_(AI::WorldState_&)>::function(&this->finally,&param_1->finally);
  std::function<void_(AI::WorldState_&,_const_AI::WorldQuerier_&,_AI::Task_&)>::function
            (&this->loop,&param_1->loop);
  std::__cxx11::string::string((string *)&this->debugName,(string *)&param_1->debugName);
  bVar3 = param_1->isLastInCompound;
  this->isImmediate = param_1->isImmediate;
  this->isLastInCompound = bVar3;
  this->failed = param_1->failed;
  TaskParameters::TaskParameters(&this->parameters,&param_1->parameters);
  return;
}

Assistant:

Task(std::string debugName, TaskType type = TaskType::Simple)
			: type{type}, debugName{debugName}
			{}